

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nested_loop_join_inner.cpp
# Opt level: O2

idx_t duckdb::RefineNestedLoopJoin::Operation<unsigned_char,duckdb::GreaterThanEquals>
                (Vector *left,Vector *right,idx_t left_size,idx_t right_size,idx_t *lpos,idx_t *rpos
                ,SelectionVector *lvector,SelectionVector *rvector,idx_t current_match_count)

{
  sel_t *psVar1;
  sel_t *psVar2;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  idx_t i;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  UnifiedVectorFormat left_data;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(left,left_size,&local_78);
  Vector::ToUnifiedFormat(right,right_size,&local_c0);
  psVar1 = lvector->sel_vector;
  psVar2 = rvector->sel_vector;
  iVar3 = 0;
  for (uVar7 = 0; current_match_count != uVar7; uVar7 = uVar7 + 1) {
    uVar8 = uVar7;
    if (psVar1 != (sel_t *)0x0) {
      uVar8 = (ulong)psVar1[uVar7];
    }
    uVar5 = uVar7;
    if (psVar2 != (sel_t *)0x0) {
      uVar5 = (ulong)psVar2[uVar7];
    }
    uVar6 = uVar8;
    if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
      uVar6 = (ulong)(local_78.sel)->sel_vector[uVar8];
    }
    uVar4 = uVar5;
    if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
      uVar4 = (ulong)(local_c0.sel)->sel_vector[uVar5];
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      bVar9 = false;
    }
    else {
      bVar9 = (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [uVar6 >> 6] >> (uVar6 & 0x3f) & 1) == 0;
    }
    if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar4 >> 6] >> (uVar4 & 0x3f) & 1) == 0;
    }
    if ((!bVar9 && !bVar10) && (local_c0.data[uVar4] <= local_78.data[uVar6])) {
      psVar1[iVar3] = (sel_t)uVar8;
      psVar2[iVar3] = (sel_t)uVar5;
      iVar3 = iVar3 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_c0);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return iVar3;
}

Assistant:

static idx_t Operation(Vector &left, Vector &right, idx_t left_size, idx_t right_size, idx_t &lpos, idx_t &rpos,
	                       SelectionVector &lvector, SelectionVector &rvector, idx_t current_match_count) {
		using MATCH_OP = ComparisonOperationWrapper<OP>;

		UnifiedVectorFormat left_data, right_data;
		left.ToUnifiedFormat(left_size, left_data);
		right.ToUnifiedFormat(right_size, right_data);

		// refine phase of the nested loop join
		// refine lvector and rvector based on matches of subsequent conditions (in case there are multiple conditions
		// in the join)
		D_ASSERT(current_match_count > 0);
		auto ldata = UnifiedVectorFormat::GetData<T>(left_data);
		auto rdata = UnifiedVectorFormat::GetData<T>(right_data);
		idx_t result_count = 0;
		for (idx_t i = 0; i < current_match_count; i++) {
			auto lidx = lvector.get_index(i);
			auto ridx = rvector.get_index(i);
			auto left_idx = left_data.sel->get_index(lidx);
			auto right_idx = right_data.sel->get_index(ridx);
			bool left_is_valid = left_data.validity.RowIsValid(left_idx);
			bool right_is_valid = right_data.validity.RowIsValid(right_idx);
			if (MATCH_OP::Operation(ldata[left_idx], rdata[right_idx], !left_is_valid, !right_is_valid)) {
				lvector.set_index(result_count, lidx);
				rvector.set_index(result_count, ridx);
				result_count++;
			}
		}
		return result_count;
	}